

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall
TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry>::DoDelete
          (TArray<ACSStringPool::PoolEntry,_ACSStringPool::PoolEntry> *this,uint first,uint last)

{
  long lVar1;
  ulong uVar2;
  
  if (last != 0xffffffff) {
    uVar2 = (ulong)first;
    lVar1 = uVar2 * 0x18;
    for (; uVar2 <= last; uVar2 = uVar2 + 1) {
      FString::~FString((FString *)((long)&(this->Array->Str).Chars + lVar1));
      lVar1 = lVar1 + 0x18;
    }
    return;
  }
  __assert_fail("last != ~0u",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/tarray.h"
                ,0x1ad,
                "void TArray<ACSStringPool::PoolEntry>::DoDelete(unsigned int, unsigned int) [T = ACSStringPool::PoolEntry, TT = ACSStringPool::PoolEntry]"
               );
}

Assistant:

void DoDelete (unsigned int first, unsigned int last)
	{
		assert (last != ~0u);
		for (unsigned int i = first; i <= last; ++i)
		{
			Array[i].~T();
		}
	}